

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

void __thiscall DataSet::save(DataSet *this,string *filepath,WriteInfo *info)

{
  char cVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer pbVar4;
  uint row;
  ulong uVar5;
  uint col;
  ulong uVar6;
  double dVar7;
  ofstream file;
  Shape local_240;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)filepath,_S_out);
  if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
    if (info->shape_skip == false) {
      local_240.n_row = (this->m_matrix).m_shape.n_row;
      local_240.n_col = (this->m_matrix).m_shape.n_col;
      local_240.is_diogonal = (this->m_matrix).m_shape.is_diogonal;
      poVar3 = operator<<((ostream *)&local_230,&local_240);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    cVar1 = (char)(ostream *)&local_230;
    if ((info->header_skip == false) &&
       ((this->m_labels).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_labels).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      pbVar4 = (this->m_labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_labels).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
        uVar2 = 1;
        uVar6 = 0;
        do {
          uVar5 = uVar2;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_230,pbVar4[uVar6]._M_dataplus._M_p,
                     pbVar4[uVar6]._M_string_length);
          if (uVar6 < ((long)(this->m_labels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_labels).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
            local_240.n_row._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_230,(char *)&local_240,1);
          }
          pbVar4 = (this->m_labels).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar2 = (ulong)((int)uVar5 + 1);
          uVar6 = uVar5;
        } while (uVar5 < (ulong)((long)(this->m_labels).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >>
                                5));
      }
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    if ((this->m_matrix).m_shape.n_row != 0) {
      row = 0;
      do {
        if ((this->m_matrix).m_shape.n_col != 0) {
          col = 0;
          do {
            dVar7 = Matrix<double>::get(&this->m_matrix,row,col);
            std::ostream::_M_insert<double>(dVar7);
            if (col < (this->m_matrix).m_shape.n_col - 1) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,", ",2);
            }
            col = col + 1;
          } while (col < (this->m_matrix).m_shape.n_col);
        }
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        row = row + 1;
      } while (row < (this->m_matrix).m_shape.n_row);
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [saving dataset]: Couldn\'t open up the file!\n");
  exit(1);
}

Assistant:

void DataSet::save(const std::string& filepath, const WriteInfo& info) const{
    std::ofstream file(filepath);
    
    if(!file){
        std::cout<<"ERROR [saving dataset]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        file<<m_matrix.shape()<<std::endl;
    }
    if(!info.header_skip && !m_labels.empty()){
        for(unsigned i=0;i<m_labels.size();++i){
            file<<m_labels[i];
            if(i<m_labels.size()-1) file<<',';
        }   file<<std::endl;
    }

    for(unsigned i=0;i<m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<m_matrix.shape().n_col;++j){
            file<<m_matrix.get(i,j);
            if(j<m_matrix.shape().n_col-1) file<<", ";
        }   file<<std::endl;
    }

    file.close();
}